

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  undefined8 *in_RDI;
  allocator local_69;
  string local_68 [32];
  string local_48 [28];
  int in_stack_ffffffffffffffd4;
  text *in_stack_ffffffffffffffd8;
  
  poVar1 = (ostream *)std::ostream::operator<<((void *)*in_RDI,*(int *)(in_RDI + 1));
  poVar1 = std::operator<<(poVar1," selected ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"test",&local_69);
  std::__cxx11::string::string(local_48,local_68);
  pluralise(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffd8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }